

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplePacketizerReader.cpp
# Opt level: O0

void __thiscall SimplePacketizerReader::doMplsCorrection(SimplePacketizerReader *this)

{
  int iVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  SimplePacketizerReader *this_local;
  
  if (((this->m_curMplsIndex != -1) && (this->m_lastMplsTime - 58800.0 <= this->m_curPts)) &&
     (iVar1 = this->m_curMplsIndex,
     sVar3 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::size(&this->m_mplsInfo),
     iVar1 < (int)sVar3 + -1)) {
    this->m_curMplsIndex = this->m_curMplsIndex + 1;
    pvVar4 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       (&this->m_mplsInfo,(long)this->m_curMplsIndex);
    if (pvVar4->connection_condition == '\x05') {
      this->m_mplsOffset = (this->m_curPts - this->m_lastMplsTime) + this->m_mplsOffset;
    }
    pvVar4 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       (&this->m_mplsInfo,(long)this->m_curMplsIndex);
    uVar2 = pvVar4->OUT_time;
    pvVar4 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       (&this->m_mplsInfo,(long)this->m_curMplsIndex);
    this->m_lastMplsTime = (double)(uVar2 - pvVar4->IN_time) * 117600.0 + this->m_lastMplsTime;
  }
  return;
}

Assistant:

void SimplePacketizerReader::doMplsCorrection()
{
    if (m_curMplsIndex == -1)
        return;
    if (m_curPts >= (m_lastMplsTime - mplsEps) && m_curMplsIndex < static_cast<int>(m_mplsInfo.size() - 1))
    {
        m_curMplsIndex++;
        if (m_mplsInfo[m_curMplsIndex].connection_condition == 5)
        {
            m_mplsOffset += m_curPts - m_lastMplsTime;
        }
        m_lastMplsTime +=
            (m_mplsInfo[m_curMplsIndex].OUT_time - m_mplsInfo[m_curMplsIndex].IN_time) * (INTERNAL_PTS_FREQ / 45000.0);
    }
}